

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Mapping.c
# Opt level: O1

void add_cx(MCInst *MI)

{
  uint8_t *puVar1;
  cs_mode cVar2;
  cs_detail *pcVar3;
  uint8_t uVar4;
  
  if (MI->csh->detail != CS_OPT_OFF) {
    cVar2 = MI->csh->mode;
    uVar4 = '\f';
    if ((cVar2 & CS_MODE_16) == CS_MODE_ARM) {
      uVar4 = ((cVar2 & CS_MODE_32) == CS_MODE_ARM) * '\x10' + '\x16';
    }
    pcVar3 = MI->flat_insn->detail;
    pcVar3->regs_read[pcVar3->regs_read_count] = uVar4;
    pcVar3 = MI->flat_insn->detail;
    pcVar3->regs_read_count = pcVar3->regs_read_count + '\x01';
    pcVar3->regs_write[pcVar3->regs_write_count] = uVar4;
    puVar1 = &MI->flat_insn->detail->regs_write_count;
    *puVar1 = *puVar1 + '\x01';
  }
  return;
}

Assistant:

static void add_cx(MCInst *MI)
{
	if (MI->csh->detail) {
		x86_reg cx;

		if (MI->csh->mode & CS_MODE_16)
			cx = X86_REG_CX;
		else if (MI->csh->mode & CS_MODE_32)
			cx = X86_REG_ECX;
		else	// 64-bit
			cx = X86_REG_RCX;

		MI->flat_insn->detail->regs_read[MI->flat_insn->detail->regs_read_count] = cx;
		MI->flat_insn->detail->regs_read_count++;

		MI->flat_insn->detail->regs_write[MI->flat_insn->detail->regs_write_count] = cx;
		MI->flat_insn->detail->regs_write_count++;
	}
}